

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::LogButtons(void)

{
  ImVec2 local_34;
  byte local_29;
  bool log_to_clipboard;
  byte local_1d;
  bool log_to_file;
  byte local_11;
  ImGuiContext *pIStack_10;
  bool log_to_tty;
  ImGuiContext *g;
  
  pIStack_10 = GImGui;
  PushID("LogButtons");
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffe4,0.0,0.0);
  local_11 = Button("Log To TTY",(ImVec2 *)&stack0xffffffffffffffe4);
  SameLine(0.0,-1.0);
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd8,0.0,0.0);
  local_1d = Button("Log To File",(ImVec2 *)&stack0xffffffffffffffd8);
  SameLine(0.0,-1.0);
  ImVec2::ImVec2(&local_34,0.0,0.0);
  local_29 = Button("Log To Clipboard",&local_34);
  SameLine(0.0,-1.0);
  PushAllowKeyboardFocus(false);
  SetNextItemWidth(80.0);
  SliderInt("Default Depth",&pIStack_10->LogDepthToExpandDefault,0,9,(char *)0x0,0);
  PopAllowKeyboardFocus();
  PopID();
  if ((local_11 & 1) != 0) {
    LogToTTY(-1);
  }
  if ((local_1d & 1) != 0) {
    LogToFile(-1,(char *)0x0);
  }
  if ((local_29 & 1) != 0) {
    LogToClipboard(-1);
  }
  return;
}

Assistant:

void ImGui::LogButtons()
{
    ImGuiContext& g = *GImGui;

    PushID("LogButtons");
#ifndef IMGUI_DISABLE_TTY_FUNCTIONS
    const bool log_to_tty = Button("Log To TTY"); SameLine();
#else
    const bool log_to_tty = false;
#endif
    const bool log_to_file = Button("Log To File"); SameLine();
    const bool log_to_clipboard = Button("Log To Clipboard"); SameLine();
    PushAllowKeyboardFocus(false);
    SetNextItemWidth(80.0f);
    SliderInt("Default Depth", &g.LogDepthToExpandDefault, 0, 9, NULL);
    PopAllowKeyboardFocus();
    PopID();

    // Start logging at the end of the function so that the buttons don't appear in the log
    if (log_to_tty)
        LogToTTY();
    if (log_to_file)
        LogToFile();
    if (log_to_clipboard)
        LogToClipboard();
}